

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O0

void __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::add_fertility_params
          (AttentionalModel<dynet::LSTMBuilder> *this,Model *model,uint hidden_dim,
          bool _rnn_src_embeddings)

{
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  Dim *pDVar1;
  byte in_CL;
  int in_EDX;
  Dim *in_RSI;
  size_type in_RDI;
  undefined1 auVar2 [16];
  Dim *in_stack_fffffffffffffda0;
  Dim *in_stack_fffffffffffffda8;
  undefined4 local_244;
  undefined4 *local_240;
  undefined8 local_238;
  int local_1f4;
  int *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1b8 [16];
  undefined4 local_1a4;
  undefined4 *local_1a0;
  undefined8 local_198;
  undefined1 local_168 [16];
  int local_154;
  int *local_150;
  undefined8 local_148;
  undefined1 local_118 [16];
  int local_104;
  int *local_100;
  undefined8 local_f8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_78 [16];
  undefined1 local_68 [4];
  int local_64;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_28 [16];
  byte local_15;
  int local_14;
  Dim *local_10;
  
  local_15 = in_CL & 1;
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (local_15 == 0) {
    local_b0 = local_b8;
    local_a8 = 2;
    x_00._M_len = in_RDI;
    x_00._M_array = in_stack_fffffffffffffda8->d;
    Dim::Dim(in_RSI,x_00);
    local_78 = dynet::Model::add_parameters(in_RSI,0.0);
    *(undefined1 (*) [16])(in_RDI + 200) = local_78;
  }
  else {
    local_64 = in_EDX << 1;
    local_60 = local_68;
    local_58 = 2;
    x._M_len = in_RDI;
    x._M_array = in_RSI->d;
    Dim::Dim(in_stack_fffffffffffffda0,x);
    in_stack_fffffffffffffda8 = in_RSI;
    local_28 = dynet::Model::add_parameters(in_RSI,0.0);
    *(undefined1 (*) [16])(in_RDI + 200) = local_28;
    in_RSI = in_stack_fffffffffffffda0;
  }
  pDVar1 = local_10;
  local_104 = local_14;
  local_100 = &local_104;
  local_f8 = 1;
  x_01._M_len = in_RDI;
  x_01._M_array = in_stack_fffffffffffffda8->d;
  Dim::Dim(in_RSI,x_01);
  local_c8 = dynet::Model::add_parameters(pDVar1,0.0);
  pDVar1 = local_10;
  *(undefined1 (*) [16])(in_RDI + 0xf8) = local_c8;
  local_154 = local_14;
  local_150 = &local_154;
  local_148 = 1;
  x_02._M_len = in_RDI;
  x_02._M_array = in_stack_fffffffffffffda8->d;
  Dim::Dim(in_RSI,x_02);
  local_118 = dynet::Model::add_parameters(pDVar1,0.0);
  pDVar1 = local_10;
  *(undefined1 (*) [16])(in_RDI + 0xd8) = local_118;
  local_1a4 = 1;
  local_1a0 = &local_1a4;
  local_198 = 1;
  x_03._M_len = in_RDI;
  x_03._M_array = in_stack_fffffffffffffda8->d;
  Dim::Dim(in_RSI,x_03);
  local_168 = dynet::Model::add_parameters(pDVar1,0.0);
  pDVar1 = local_10;
  *(undefined1 (*) [16])(in_RDI + 0x108) = local_168;
  local_1f4 = local_14;
  local_1f0 = &local_1f4;
  local_1e8 = 1;
  x_04._M_len = in_RDI;
  x_04._M_array = in_stack_fffffffffffffda8->d;
  Dim::Dim(in_RSI,x_04);
  local_1b8 = dynet::Model::add_parameters(pDVar1,0.0);
  *(undefined1 (*) [16])(in_RDI + 0xe8) = local_1b8;
  local_244 = 1;
  local_240 = &local_244;
  local_238 = 1;
  x_05._M_len = in_RDI;
  x_05._M_array = in_stack_fffffffffffffda8->d;
  Dim::Dim(in_RSI,x_05);
  auVar2 = dynet::Model::add_parameters(local_10,0.0);
  *(undefined1 (*) [16])(in_RDI + 0x118) = auVar2;
  *(undefined1 *)(in_RDI + 0x39d) = 1;
  return;
}

Assistant:

void AttentionalModel<Builder>::add_fertility_params(dynet::Model* model, unsigned hidden_dim, bool _rnn_src_embeddings)
{
    if (_rnn_src_embeddings) {
         p_Wfhid = model->add_parameters({hidden_dim, 2*hidden_dim});
     } else {
         p_Wfhid = model->add_parameters({hidden_dim, hidden_dim});
     }
     p_bfhid = model->add_parameters({hidden_dim});
     p_Wfmu = model->add_parameters({hidden_dim});
     p_bfmu = model->add_parameters({1});
     p_Wfvar = model->add_parameters({hidden_dim});
     p_bfvar = model->add_parameters({1});

     global_fertility = true;
}